

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O0

void checkForError(bool condition,int line,string *message)

{
  runtime_error *this;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *message_local;
  int line_local;
  bool condition_local;
  
  if (!condition) {
    local_18 = message;
    message_local._0_4_ = line;
    message_local._7_1_ = condition;
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_98,(int)message_local);
    std::operator+(&local_78,"VulkanHppGenerator: Spec error on line ",&local_98);
    std::operator+(&local_58,&local_78,": ");
    std::operator+(&local_38,&local_58,local_18);
    std::runtime_error::runtime_error(this,(string *)&local_38);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

inline void checkForError( bool condition, int line, std::string const & message )
{
  if ( !condition )
  {
    throw std::runtime_error( "VulkanHppGenerator: Spec error on line " + std::to_string( line ) + ": " + message );
  }
}